

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemeditorfactory.cpp
# Opt level: O3

void __thiscall QExpandingLineEdit::changeEvent(QExpandingLineEdit *this,QEvent *e)

{
  short sVar1;
  
  sVar1 = *(short *)(e + 8);
  if (((sVar1 == 0x61) || (sVar1 == 0xb2)) || (sVar1 == 100)) {
    updateMinimumWidth(this);
  }
  QLineEdit::changeEvent((QLineEdit *)this,e);
  return;
}

Assistant:

void QExpandingLineEdit::changeEvent(QEvent *e)
{
    switch (e->type())
    {
    case QEvent::FontChange:
    case QEvent::StyleChange:
    case QEvent::ContentsRectChange:
        updateMinimumWidth();
        break;
    default:
        break;
    }

    QLineEdit::changeEvent(e);
}